

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

Matrix3f * __thiscall Matrix3f::transposed(Matrix3f *__return_storage_ptr__,Matrix3f *this)

{
  undefined4 uVar1;
  int i;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  
  Matrix3f(__return_storage_ptr__,0.0);
  lVar2 = 0;
  pfVar3 = __return_storage_ptr__->m_elements;
  for (; lVar2 != 3; lVar2 = lVar2 + 1) {
    lVar5 = 0;
    pfVar4 = this->m_elements;
    for (; lVar5 != 3; lVar5 = lVar5 + 1) {
      uVar1 = *pfVar4;
      pfVar4 = pfVar4 + 3;
      pfVar3[lVar5] = (float)uVar1;
    }
    pfVar3 = pfVar3 + 3;
    this = (Matrix3f *)((long)this + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::transposed() const
{
	Matrix3f out;
	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			out( j, i ) = ( *this )( i, j );
		}
	}

	return out;
}